

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_xprt.c
# Opt level: O0

void svc_xprt_clear(SVCXPRT *xprt)

{
  ulong uVar1;
  rbtree_x_part *prVar2;
  _Bool _Var3;
  int iVar4;
  int rc_1;
  int rc;
  rbtree_x_part *t;
  SVCXPRT *xprt_local;
  
  _Var3 = svc_xprt_init_failure();
  if ((!_Var3) &&
     (_Var3 = opr_rbtree_node_valid((opr_rbtree_node *)((long)&xprt[1].xp_lock + 8)),
     prVar2 = svc_xprt_fd.xt.tree, _Var3)) {
    uVar1 = (ulong)(uint)xprt->xp_fd % (ulong)svc_xprt_fd.xt.npart;
    atomic_dec_uint32_t(&svc_xprt_fd.connections);
    iVar4 = pthread_rwlock_wrlock((pthread_rwlock_t *)&prVar2[uVar1].lock);
    if (iVar4 != 0) {
      abort();
    }
    opr_rbtree_remove(&prVar2[uVar1].t,(opr_rbtree_node *)((long)&xprt[1].xp_lock + 8));
    iVar4 = pthread_rwlock_unlock((pthread_rwlock_t *)&prVar2[uVar1].lock);
    if (iVar4 != 0) {
      abort();
    }
  }
  return;
}

Assistant:

void
svc_xprt_clear(SVCXPRT *xprt)
{
	struct rbtree_x_part *t;

	if (svc_xprt_init_failure())
		return;

	/* xprt lock ensures only one active thread here */
	if (opr_rbtree_node_valid(&REC_XPRT(xprt)->fd_node)) {
		t = rbtx_partition_of_scalar(&svc_xprt_fd.xt, xprt->xp_fd);

		/* if another thread passes test during svc_xprt_shutdown(),
		 * this lock (and generation test) prevents repeats.
		 */
		atomic_dec_uint32_t(&svc_xprt_fd.connections);
		rwlock_wrlock(&t->lock);
		opr_rbtree_remove(&t->t, &REC_XPRT(xprt)->fd_node);
		rwlock_unlock(&t->lock);
	}
}